

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader-test.c++
# Opt level: O3

void __thiscall
capnp::_::anon_unknown_0::FakeLoaderCallback::load
          (FakeLoaderCallback *this,SchemaLoader *loader,uint64_t id)

{
  uint64_t local_28;
  unsigned_long local_20;
  
  if (id == 0x4d2) {
    return;
  }
  local_28 = id;
  if ((this->node)._reader.dataSize < 0x40) {
    if (id == 0 || 2 < kj::_::Debug::minSeverity) goto LAB_002bb3c4;
    local_20 = 0;
  }
  else {
    if (*(this->node)._reader.data == id || 2 < kj::_::Debug::minSeverity) goto LAB_002bb3c4;
    local_20 = *(this->node)._reader.data;
  }
  kj::_::Debug::log<char_const(&)[40],unsigned_long,unsigned_long&>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader-test.c++"
             ,0x11e,ERROR,"\"failed: expected \" \"(node.getId()) == (id)\", node.getId(), id",
             (char (*) [40])"failed: expected (node.getId()) == (id)",&local_20,&local_28);
LAB_002bb3c4:
  if ((this->loaded == true) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[27]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x11f,ERROR,"\"failed: expected \" \"!(loaded)\"",
               (char (*) [27])"failed: expected !(loaded)");
  }
  this->loaded = true;
  SchemaLoader::loadOnce(loader,&this->node);
  return;
}

Assistant:

void load(const SchemaLoader& loader, uint64_t id) const override {
    if (id == 1234) {
      // Magic "not found" ID.
      return;
    }

    EXPECT_EQ(node.getId(), id);
    EXPECT_FALSE(loaded);
    loaded = true;
    loader.loadOnce(node);
  }